

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap4_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  TT_CMap4 cmap4;
  FT_UInt gindex;
  FT_UInt32 *pchar_code_local;
  TT_CMap cmap_local;
  
  if (*pchar_code < 0xffff) {
    if ((cmap->flags & 1U) == 0) {
      if (*pchar_code == *(FT_UInt32 *)&cmap[1].cmap.charmap.face) {
        tt_cmap4_next((TT_CMap4)cmap);
        cmap4._4_4_ = *(FT_UInt *)((long)&cmap[1].cmap.charmap.face + 4);
        if (cmap4._4_4_ != 0) {
          *pchar_code = *(FT_UInt32 *)&cmap[1].cmap.charmap.face;
        }
      }
      else {
        cmap4._4_4_ = tt_cmap4_char_map_binary(cmap,pchar_code,'\x01');
      }
    }
    else {
      cmap4._4_4_ = tt_cmap4_char_map_linear(cmap,pchar_code,'\x01');
    }
    cmap_local._4_4_ = cmap4._4_4_;
  }
  else {
    cmap_local._4_4_ = 0;
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap4_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt  gindex;


    if ( *pchar_code >= 0xFFFFU )
      return 0;

    if ( cmap->flags & TT_CMAP_FLAG_UNSORTED )
      gindex = tt_cmap4_char_map_linear( cmap, pchar_code, 1 );
    else
    {
      TT_CMap4  cmap4 = (TT_CMap4)cmap;


      /* no need to search */
      if ( *pchar_code == cmap4->cur_charcode )
      {
        tt_cmap4_next( cmap4 );
        gindex = cmap4->cur_gindex;
        if ( gindex )
          *pchar_code = cmap4->cur_charcode;
      }
      else
        gindex = tt_cmap4_char_map_binary( cmap, pchar_code, 1 );
    }

    return gindex;
  }